

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableElimination.cpp
# Opt level: O2

PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
* __thiscall
Inferences::ALASCA::
PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
::next(PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
       *this)

{
  PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *this_00;
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  reference rVar6;
  reference rVar7;
  allocator_type local_92;
  bool local_91;
  PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *local_90;
  OptionBase<std::vector<bool,_std::allocator<bool>_>_> local_88;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  local_90 = (PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)this;
  if (this[0x20] ==
      (PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
       )0x0) {
    local_91 = false;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_58,
               *(long *)(this + 0x10) - *(long *)(this + 8) >> 6,&local_91,&local_92);
    Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::OptionBase
              (&local_88,(vector<bool,_std::allocator<bool>_> *)&local_58);
    Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::operator=
              ((OptionBase<std::vector<bool,_std::allocator<bool>_>_> *)(this + 0x20),&local_88);
    Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::~OptionBase(&local_88);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
    if (*(long *)(this + 0x10) != *(long *)(this + 8)) {
      return (PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)this;
    }
  }
  else {
    this_00 = this + 0x28;
    uVar4 = 1;
    while( true ) {
      uVar3 = (ulong)(uVar4 - 1);
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)this_00,uVar3);
      uVar1 = *rVar6._M_p;
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)this_00,uVar3);
      uVar5 = rVar7._M_mask & *rVar7._M_p;
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)this_00,uVar3);
      uVar3 = rVar7._M_mask;
      puVar2 = rVar7._M_p;
      if ((uVar1 & rVar6._M_mask) == 0) break;
      if (uVar5 == 0) {
        uVar3 = *puVar2 | uVar3;
      }
      else {
        uVar3 = ~uVar3 & *puVar2;
      }
      *puVar2 = uVar3;
      uVar4 = uVar4 + 1;
    }
    if (uVar5 == 0) {
      uVar3 = *puVar2 | uVar3;
    }
    else {
      uVar3 = ~uVar3 & *puVar2;
    }
    *puVar2 = uVar3;
    if ((ulong)uVar4 <
        (ulong)((long)(local_90->_orig)._cursor - (long)(local_90->_orig)._stack >> 6)) {
      return local_90;
    }
  }
  local_90->_finished = true;
  return local_90;
}

Assistant:

PartitionIter& next() { 
    if (_partition.isNone()) {
      _partition = some(std::vector<bool>(_orig.size(), false));
      if (_orig.size() == 0) {
        _finished = true;
      }
    } else {
      auto& par = _partition.unwrap();
      unsigned i = 0;
      for (; par[i]; i++) {
        par[i] = !par[i];
      }
      par[i] = !par[i];
      if (i + 1 >= _orig.size()) {
        _finished = true;
      }
    }
    return *this;
  }